

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.c
# Opt level: O3

char * preprocess(char *source)

{
  byte bVar1;
  char cVar2;
  char **ppcVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  void *__ptr;
  FILE *source_00;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int local_4c;
  char *local_48;
  int local_3c;
  char *local_38;
  
  local_4c = 0;
  inprocess = inprocess + 1;
  pcVar6 = (char *)malloc(1);
  *pcVar6 = '\0';
  if (*source == '\0') {
    free(source);
  }
  else {
    uVar12 = 0;
    local_3c = 0;
    local_48 = pcVar6;
    local_38 = source;
    do {
      pcVar7 = readline(source,&local_4c);
      uVar12 = uVar12 + 1;
      sVar8 = strlen(pcVar7);
      pcVar6 = local_48;
      uVar4 = (uint)sVar8;
      if ((int)uVar4 < 7) {
LAB_00106d91:
        if ((int)uVar4 < 1) {
          uVar11 = 0;
LAB_00106e07:
          if ((uint)uVar11 != uVar4) {
            cVar2 = pcVar7[uVar11 & 0xffffffff];
            if (((cVar2 != '\n') && (cVar2 != '\r')) &&
               ((cVar2 != '/' || (int)(uVar4 - 1) <= (int)(uint)uVar11 ||
                (pcVar7[(uVar11 & 0xffffffff) + 1] != '/')))) {
              if ((int)uVar4 < 1) {
                uVar11 = 0;
LAB_00106fb0:
                if (((int)uVar11 < (int)(uVar4 - 1)) &&
                   ((pcVar7[uVar11 & 0xffffffff] == '/' &&
                    (pcVar7[(uVar11 & 0xffffffff) + 1] == '*')))) {
                  while( true ) {
                    sVar8 = strlen(pcVar7);
                    iVar5 = (int)sVar8;
                    if ((2 < iVar5) && ((pcVar7[iVar5 - 2] == '/' && (pcVar7[iVar5 - 3] == '*'))))
                    break;
                    free(pcVar7);
                    pcVar7 = readline(source,&local_4c);
                  }
                  free(pcVar7);
                  goto LAB_0010703e;
                }
              }
              else {
                uVar11 = 0;
                do {
                  if ((pcVar7[uVar11] != ' ') && (pcVar7[uVar11] != '\t')) goto LAB_00106fb0;
                  uVar11 = uVar11 + 1;
                } while ((uVar4 & 0x7fffffff) != uVar11);
              }
              pcVar10 = str_append(local_48,pcVar7);
              free(pcVar6);
              free(pcVar7);
              local_48 = pcVar10;
            }
          }
        }
        else {
          uVar11 = 0;
          do {
            if ((pcVar7[uVar11] != ' ') && (pcVar7[uVar11] != '\t')) goto LAB_00106e07;
            uVar11 = uVar11 + 1;
          } while ((uVar4 & 0x7fffffff) != uVar11);
        }
      }
      else {
        lVar13 = 0;
        do {
          if (pcVar7[lVar13] != "Include"[lVar13]) goto LAB_00106d91;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 7);
        __ptr = (void *)0x0;
        sVar8 = 0;
        while( true ) {
          bVar1 = pcVar7[sVar8 + 8];
          if ((bVar1 < 0xe) && ((0x2401U >> (bVar1 & 0x1f) & 1) != 0)) break;
          __ptr = realloc(__ptr,sVar8 + 1);
          *(byte *)((long)__ptr + sVar8) = bVar1;
          sVar8 = sVar8 + 1;
        }
        pcVar6 = (char *)realloc(__ptr,(ulong)((int)sVar8 + 1));
        pcVar6[sVar8] = '\0';
        ppcVar3 = inclusionTable;
        lVar13 = (long)count;
        if (0 < lVar13) {
          lVar14 = 0;
          do {
            iVar5 = strcmp(ppcVar3[lVar14],pcVar6);
            if (iVar5 == 0) {
              printf("\x1b[32m\n[Debug] [Preprocessor] Skipping duplicate inclusion of %s\x1b[0m",
                     pcVar6);
              free(pcVar6);
              free(pcVar7);
              source = local_38;
              goto LAB_0010703e;
            }
            lVar14 = lVar14 + 1;
          } while (lVar13 != lVar14);
        }
        source_00 = fopen(pcVar6,"rb");
        if (source_00 == (FILE *)0x0) {
          printf("\x1b[33m\n[Warning] [Line %d] Unable to open file for inclusion : %s\x1b[0m",
                 (ulong)uVar12,pcVar6);
        }
        else {
          local_3c = local_3c + 1;
          pcVar10 = read_all((FILE *)source_00);
          lVar13 = (long)count;
          count = count + 1;
          inclusionTable = (char **)realloc(inclusionTable,lVar13 * 8 + 8);
          pcVar7 = local_48;
          inclusionTable[lVar13] = pcVar6;
          pcVar9 = str_append(local_48,pcVar10);
          free(pcVar10);
          free(pcVar7);
          local_48 = pcVar9;
        }
        free(pcVar6);
        source = local_38;
      }
LAB_0010703e:
    } while (source[local_4c] != '\0');
    free(source);
    pcVar6 = local_48;
    if (local_3c != 0) {
      pcVar6 = preprocess(local_48);
    }
  }
  ppcVar3 = inclusionTable;
  inprocess = inprocess + -1;
  if (inprocess == 0) {
    lVar13 = (long)count;
    if (0 < lVar13) {
      lVar14 = 0;
      do {
        free(ppcVar3[lVar14]);
        lVar14 = lVar14 + 1;
      } while (lVar13 != lVar14);
    }
    free(ppcVar3);
  }
  return pcVar6;
}

Assistant:

char* preprocess(char *source){
    int i = 0, lcount = 0, hasInclude = 0;
    inprocess++;
    char *result = (char *)mallocate(sizeof(char) * 1), *bak = NULL;
    result[0] = '\0';
    while(source[i] != '\0'){
        char *line = readline(source, &i);
     //   printf(debug("Line : [%s]"), line);
        lcount++;
        if(startsWith(line, "Include")){
            char *toInclude = str_part(line, 8); // Include
            if(has_in_table(toInclude)){
                printf(debug("[Preprocessor] Skipping duplicate inclusion of %s"), toInclude);
                memfree(toInclude);
                memfree(line);
                continue;
            }
            FILE *include = fopen(toInclude, "rb");
            if(include == NULL)
                printf(warning("[Line %d] Unable to open file for inclusion : %s"), lcount, toInclude);
            else{
                hasInclude++;
                char *content = read_all(include);
                add_to_table(toInclude);
                bak = result;
                result = str_append(result, content);
                memfree(content);
                memfree(bak);
            }
            memfree(toInclude);
        }
        else if(!isEmpty(line)){
            if(is_start_of_mc(line)){
                while(!is_end_of_mc(line)){
                    memfree(line);
                    line = readline(source, &i);
                }
                memfree(line);
            }
            else{
                bak = result;
                result = str_append(result, line);
                memfree(bak);
                memfree(line);
            }
        }
       // memfree(line);
    }
    memfree(source);
    if(hasInclude){
        result = preprocess(result);
    }
    inprocess--;
    if(inprocess == 0){
        i = 0;
        while(i < count){
            memfree(inclusionTable[i]);
            i++;
        }
        memfree(inclusionTable);
    }
    return result;
}